

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O2

QRgbaFloat32 *
fetchRGB30ToRGBA32F<(QtPixelOrder)0>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  ulong uVar1;
  ulong uVar2;
  QRgbaFloat32 QVar3;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)count;
  if (count < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 * 4 != uVar2; uVar2 = uVar2 + 4) {
    QVar3 = qConvertA2rgb30ToRgbaFP<(QtPixelOrder)0>(*(uint *)(src + uVar2 + (long)index * 4));
    *(QRgbaFloat32 *)(&buffer->r + uVar2) = QVar3;
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchRGB30ToRGBA32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                       const QList<QRgb> *, QDitherInfo *)
{
    return convertA2RGB30PMToRGBA32F<PixelOrder>(buffer, reinterpret_cast<const uint *>(src) + index, count, nullptr, nullptr);
}